

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stringtable.cpp
# Opt level: O0

void __thiscall
FStringTable::LoadLanguage(FStringTable *this,int lumpnum,DWORD code,bool exactMatch,int passnum)

{
  undefined1 copyStr [8];
  bool bVar1;
  bool bVar2;
  bool bVar3;
  uint uVar4;
  int iVar5;
  int iVar6;
  uint uVar7;
  long lVar8;
  size_t sVar9;
  char *pcVar10;
  size_t sVar11;
  StringEntry *pSVar12;
  FString local_178;
  FString strText;
  FString strName;
  bool savedskip;
  size_t len;
  bool forceskip;
  bool donot;
  undefined1 local_148 [8];
  FScanner sc;
  int local_40;
  bool skip;
  int cmpval;
  DWORD bucket;
  StringEntry **pentry;
  StringEntry *entry;
  DWORD inCode;
  DWORD orMask;
  int passnum_local;
  bool exactMatch_local;
  DWORD code_local;
  int lumpnum_local;
  FStringTable *this_local;
  
  uVar4 = 0xff0000;
  if (exactMatch) {
    uVar4 = 0;
  }
  entry._0_4_ = 0;
  sc.Escape = true;
  FScanner::FScanner((FScanner *)local_148,lumpnum);
  FScanner::SetCMode((FScanner *)local_148,true);
  bVar1 = sc.Escape;
LAB_0065db7e:
  do {
    sc.Escape = bVar1;
    bVar1 = FScanner::GetString((FScanner *)local_148);
    if (!bVar1) {
LAB_0065e319:
      FScanner::~FScanner((FScanner *)local_148);
      return;
    }
    bVar1 = FScanner::Compare((FScanner *)local_148,"[");
    if (!bVar1) {
      if ((uint)entry == 0) {
        bVar1 = FScanner::isText((FScanner *)local_148);
        if (!bVar1) {
          if ((LoadLanguage::errordone & 1U) == 0) {
            Printf("Skipping binary \'LANGUAGE\' lump.\n");
          }
          LoadLanguage::errordone = true;
          goto LAB_0065e319;
        }
        FScanner::ScriptError((FScanner *)local_148,"Found a string without a language specified.");
      }
      bVar1 = (bool)(sc.Escape & 1);
      bVar3 = FScanner::Compare((FScanner *)local_148,"$");
      if (bVar3) {
        FScanner::MustGetStringName((FScanner *)local_148,"ifgame");
        FScanner::MustGetStringName((FScanner *)local_148,"(");
        FScanner::MustGetString((FScanner *)local_148);
        pcVar10 = GameTypeName();
        bVar3 = FScanner::Compare((FScanner *)local_148,pcVar10);
        sc.Escape = (bool)((sc.Escape | ~bVar3) & 1);
        FScanner::MustGetStringName((FScanner *)local_148,")");
        FScanner::MustGetString((FScanner *)local_148);
      }
      if ((sc.Escape & 1U) == 0) {
        FString::FString(&strText,(char *)local_148);
        FScanner::MustGetStringName((FScanner *)local_148,"=");
        FScanner::MustGetString((FScanner *)local_148);
        copyStr = local_148;
        sVar9 = ProcessEscapes((char *)local_148);
        FString::FString(&local_178,(char *)copyStr,sVar9);
        FScanner::MustGetString((FScanner *)local_148);
        while (bVar1 = FScanner::Compare((FScanner *)local_148,";"), ((bVar1 ^ 0xffU) & 1) != 0) {
          ProcessEscapes((char *)local_148);
          FString::operator+=(&local_178,(char *)local_148);
          FScanner::MustGetString((FScanner *)local_148);
        }
        pcVar10 = FString::GetChars(&strText);
        uVar7 = MakeKey(pcVar10);
        _cmpval = this->Buckets + (uVar7 & 0x7f);
        pentry = &(*_cmpval)->Next;
        local_40 = 1;
        for (; pentry != (StringEntry **)0x0; pentry = &(*pentry)->Next) {
          pSVar12 = pentry[1];
          pcVar10 = FString::GetChars(&strText);
          local_40 = strcasecmp((char *)pSVar12,pcVar10);
          if (-1 < local_40) break;
          _cmpval = pentry;
        }
        if ((local_40 == 0) && (passnum <= (int)(uint)*(byte *)(pentry + 2))) {
          *_cmpval = *pentry;
          M_Free(pentry);
          pentry = (StringEntry **)0x0;
        }
        if ((pentry == (StringEntry **)0x0) || (0 < local_40)) {
          sVar9 = FString::Len(&local_178);
          sVar11 = FString::Len(&strText);
          pSVar12 = (StringEntry *)
                    M_Malloc_Dbg(sVar9 + 0x1a + sVar11,
                                 "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/stringtable.cpp"
                                 ,0x11e);
          pSVar12->Next = *_cmpval;
          *_cmpval = pSVar12;
          pcVar10 = FString::GetChars(&local_178);
          strcpy(&pSVar12->field_0x11,pcVar10);
          sVar9 = FString::Len(&local_178);
          pSVar12->Name = &pSVar12->field_0x12 + sVar9;
          pcVar10 = FString::GetChars(&strText);
          strcpy(&pSVar12->field_0x12 + sVar9,pcVar10);
          pSVar12->PassNum = (BYTE)passnum;
        }
        FString::~FString(&local_178);
        FString::~FString(&strText);
        bVar1 = sc.Escape;
      }
      else {
        FScanner::MustGetStringName((FScanner *)local_148,"=");
        FScanner::MustGetString((FScanner *)local_148);
        do {
          FScanner::MustGetString((FScanner *)local_148);
          bVar3 = FScanner::Compare((FScanner *)local_148,";");
        } while (((bVar3 ^ 0xffU) & 1) != 0);
      }
      goto LAB_0065db7e;
    }
    bVar3 = false;
    bVar1 = false;
    sc.Escape = true;
    FScanner::MustGetString((FScanner *)local_148);
    do {
      lVar8 = (long)(int)sc.String;
      if ((lVar8 == 2) || (lVar8 == 3)) {
        uVar7 = tolower((int)*(char *)local_148);
        iVar5 = tolower((int)*(char *)((long)local_148 + 1));
        iVar6 = tolower((int)*(char *)((long)local_148 + 2));
        entry._0_4_ = uVar7 | iVar5 << 8 | iVar6 << 0x10;
LAB_0065dd34:
        if (((uint)entry | uVar4) == (code | uVar4)) {
          if (bVar3) {
            bVar1 = true;
            bVar3 = false;
          }
          else {
            sc.Escape = false;
          }
        }
        FScanner::MustGetString((FScanner *)local_148);
      }
      else {
        if ((lVar8 != 1) || (*(char *)local_148 != '~')) {
          if ((lVar8 == 1) && (*(char *)local_148 == '*')) {
            entry._0_4_ = 0x2a;
          }
          else if ((lVar8 == 7) && (iVar5 = strcasecmp((char *)local_148,"default"), iVar5 == 0)) {
            entry._0_4_ = 0x2a2a;
          }
          else {
            FScanner::ScriptError
                      ((FScanner *)local_148,
                       "The language code must be 2 or 3 characters long.\n\'%s\' is %lu characters long."
                       ,local_148,lVar8);
          }
          goto LAB_0065dd34;
        }
        bVar3 = true;
        FScanner::MustGetString((FScanner *)local_148);
      }
      bVar2 = FScanner::Compare((FScanner *)local_148,"]");
    } while (((bVar2 ^ 0xffU) & 1) != 0);
    if (bVar3) {
      FScanner::ScriptError((FScanner *)local_148,"You must specify a language after ~");
    }
    bVar1 = (sc.Escape & 1U) != 0 || bVar1;
  } while( true );
}

Assistant:

void FStringTable::LoadLanguage (int lumpnum, DWORD code, bool exactMatch, int passnum)
{
	static bool errordone = false;
	const DWORD orMask = exactMatch ? 0 : MAKE_ID(0,0,0xff,0);
	DWORD inCode = 0;
	StringEntry *entry, **pentry;
	DWORD bucket;
	int cmpval;
	bool skip = true;

	code |= orMask;

	FScanner sc(lumpnum);
	sc.SetCMode (true);
	while (sc.GetString ())
	{
		if (sc.Compare ("["))
		{ // Process language identifiers
			bool donot = false;
			bool forceskip = false;
			skip = true;
			sc.MustGetString ();
			do
			{
				size_t len = sc.StringLen;
				if (len != 2 && len != 3)
				{
					if (len == 1 && sc.String[0] == '~')
					{
						donot = true;
						sc.MustGetString ();
						continue;
					}
					if (len == 1 && sc.String[0] == '*')
					{
						inCode = MAKE_ID('*',0,0,0);
					}
					else if (len == 7 && stricmp (sc.String, "default") == 0)
					{
						inCode = MAKE_ID('*','*',0,0);
					}
					else
					{
						sc.ScriptError ("The language code must be 2 or 3 characters long.\n'%s' is %lu characters long.",
							sc.String, len);
					}
				}
				else
				{
					inCode = MAKE_ID(tolower(sc.String[0]), tolower(sc.String[1]), tolower(sc.String[2]), 0);
				}
				if ((inCode | orMask) == code)
				{
					if (donot)
					{
						forceskip = true;
						donot = false;
					}
					else
					{
						skip = false;
					}
				}
				sc.MustGetString ();
			} while (!sc.Compare ("]"));
			if (donot)
			{
				sc.ScriptError ("You must specify a language after ~");
			}
			skip |= forceskip;
		}
		else
		{ // Process string definitions.
			if (inCode == 0)
			{
				// LANGUAGE lump is bad. We need to check if this is an old binary
				// lump and if so just skip it to allow old WADs to run which contain
				// such a lump.
				if (!sc.isText())
				{
					if (!errordone) Printf("Skipping binary 'LANGUAGE' lump.\n"); 
					errordone = true;
					return;
				}
				sc.ScriptError ("Found a string without a language specified.");
			}

			bool savedskip = skip;
			if (sc.Compare("$"))
			{
				sc.MustGetStringName("ifgame");
				sc.MustGetStringName("(");
				sc.MustGetString();
				skip |= !sc.Compare(GameTypeName());
				sc.MustGetStringName(")");
				sc.MustGetString();

			}

			if (skip)
			{ // We're not interested in this language, so skip the string.
				sc.MustGetStringName ("=");
				sc.MustGetString ();
				do
				{
					sc.MustGetString ();
				} 
				while (!sc.Compare (";"));
				skip = savedskip;
				continue;
			}

			FString strName (sc.String);
			sc.MustGetStringName ("=");
			sc.MustGetString ();
			FString strText (sc.String, ProcessEscapes (sc.String));
			sc.MustGetString ();
			while (!sc.Compare (";"))
			{
				ProcessEscapes (sc.String);
				strText += sc.String;
				sc.MustGetString ();
			}

			// Does this string exist? If so, should we overwrite it?
			bucket = MakeKey (strName.GetChars()) & (HASH_SIZE-1);
			pentry = &Buckets[bucket];
			entry = *pentry;
			cmpval = 1;
			while (entry != NULL)
			{
				cmpval = stricmp (entry->Name, strName.GetChars());
				if (cmpval >= 0)
					break;
				pentry = &entry->Next;
				entry = *pentry;
			}
			if (cmpval == 0 && entry->PassNum >= passnum)
			{
				*pentry = entry->Next;
				M_Free (entry);
				entry = NULL;
			}
			if (entry == NULL || cmpval > 0)
			{
				entry = (StringEntry *)M_Malloc (sizeof(*entry) + strText.Len() + strName.Len() + 2);
				entry->Next = *pentry;
				*pentry = entry;
				strcpy (entry->String, strText.GetChars());
				strcpy (entry->Name = entry->String + strText.Len() + 1, strName.GetChars());
				entry->PassNum = passnum;
			}
		}
	}
}